

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int get_attr_id(attr_list list,int item_no,atom_t *item)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  undefined4 *in_RDX;
  int in_ESI;
  short *in_RDI;
  int total_attr_count_1;
  int other_attr_count_1;
  int int_attr_count_1;
  attr_list atl;
  int i;
  int total_attr_count;
  int other_attr_count;
  int int_attr_count;
  int local_30;
  int local_14;
  int local_4;
  
  atl_lock();
  init_global_atom_server((atom_server *)0x106823);
  atl_unlock();
  if (in_ESI < 0) {
    local_4 = 0;
  }
  else if (in_RDI == (short *)0x0) {
    local_4 = 0;
  }
  else if (*in_RDI == 0) {
    uVar2 = (uint)*(byte *)(*(long *)(in_RDI + 8) + 1);
    if (in_ESI < (int)(uVar2 + *(byte *)(*(long *)(in_RDI + 8) + 1))) {
      if (in_ESI < (int)uVar2) {
        *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 8) + 4 + (long)in_ESI * 8);
        local_4 = 1;
      }
      else {
        *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 4) + (long)(int)(in_ESI - uVar2) * 0x18);
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_14 = in_ESI;
    for (local_30 = 0; local_30 < *(int *)(in_RDI + 4); local_30 = local_30 + 1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 8) + (long)local_30 * 8);
      uVar2 = (uint)*(byte *)(*(long *)(lVar1 + 0x10) + 1);
      iVar3 = uVar2 + *(byte *)(*(long *)(lVar1 + 0x10) + 1);
      if (local_14 <= iVar3) {
        if (local_14 < (int)uVar2) {
          *in_RDX = *(undefined4 *)(*(long *)(lVar1 + 0x10) + 4 + (long)local_14 * 8);
          return 1;
        }
        *in_RDX = *(undefined4 *)(*(long *)(lVar1 + 8) + (long)(int)(local_14 - uVar2) * 0x18);
        return 1;
      }
      local_14 = local_14 - iVar3;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

extern int
get_attr_id(attr_list list, int item_no, atom_t *item)
{

    atl_lock();
    init_global_atom_server(&global_as);
    atl_unlock();

    if (item_no < 0) return 0;

    if (list == NULL) return 0;

    if (!list->list_of_lists) {
        int int_attr_count = list->l.list.iattrs->int_attr_count;
        int other_attr_count = list->l.list.iattrs->int_attr_count;
        int total_attr_count = int_attr_count + other_attr_count;

        if (item_no >= total_attr_count) return 0;

        if (item_no < int_attr_count) {
            *item = list->l.list.iattrs->iattr[item_no].attr_id;
	    return 1;
        } else {
            item_no -= int_attr_count;
            *item = list->l.list.attributes[item_no].attr_id;
	    return 1;
        }
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            attr_list atl = list->l.lists.lists[i];
            int int_attr_count = atl->l.list.iattrs->int_attr_count;
            int other_attr_count = atl->l.list.iattrs->int_attr_count;
            int total_attr_count = int_attr_count + other_attr_count;

            if (item_no > total_attr_count) {
                item_no -= total_attr_count;
	    } else {
                if (item_no < int_attr_count) {
                    *item = atl->l.list.iattrs->iattr[item_no].attr_id;
		    return 1;
                } else {
                    item_no -= int_attr_count;
                    *item = atl->l.list.attributes[item_no].attr_id;
		    return 1;
                }
            }
        }
    }
    return 0;
}